

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viras.h
# Opt level: O1

FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
* __thiscall
viras::
Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
::quantifier_elimination
          (FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
           *__return_storage_ptr__,
          Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          *this,Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                *x,vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
                   *lits)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *pCVar4;
  uint64_t uVar5;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  *p_Var6;
  type *ptVar7;
  bool bVar8;
  _Variant_storage<_98354317_> local_1b10;
  char local_1620;
  undefined1 local_1618;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  _Stack_1610;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  *local_15e0;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *pvStack_15d8;
  Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
  *local_15d0;
  TermList TStack_15c8;
  unsigned_long local_15b8;
  unsigned_long uStack_15b0;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *local_15a8;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *pVStack_15a0;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *local_1598;
  _Variant_storage<_98354317_> local_1590;
  char local_10a0;
  undefined1 local_1098;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  local_1090;
  unsigned_long local_1058;
  unsigned_long uStack_1050;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *local_1048;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *pVStack_1040;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *local_1038;
  _Variant_storage<_98354317_> local_1030;
  char local_b40;
  undefined1 local_b38;
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  local_b30;
  MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>
  local_af8;
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>
  local_580;
  
  elim_set(&local_580,this,x,lits);
  pCVar4 = (x->
           super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
           ).config;
  uVar5 = (x->
          super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
          ).inner.super_TermList._content;
  local_1598 = local_580.i.outer.f.x;
  local_15a8 = local_580.i.outer.i.f.a;
  pVStack_15a0 = local_580.i.outer.f.this;
  local_15b8 = local_580.i.outer.i.i.lower;
  uStack_15b0 = local_580.i.outer.i.i.upper;
  local_10a0 = 0;
  bVar8 = local_580.i.inner.super__Optional_base<_163239de_>._M_payload.
          super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged ==
          true;
  if (bVar8) {
    std::__detail::__variant::_Move_ctor_base<$98354317$>::_Move_ctor_base
              ((_Move_ctor_base<_98354317_> *)&local_1590,
               (_Move_ctor_base<_98354317_> *)&local_580.i.inner);
  }
  p_Var1 = &local_1090._M_impl.super__Rb_tree_header;
  local_1098 = local_580.i.init;
  if (local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    ptVar7 = (type *)&local_1090._M_impl;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  else {
    p_Var2 = &local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_color =
         local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_left =
         local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_right =
         local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
         &p_Var1->_M_header;
    ptVar7 = &local_580.f;
    local_1090._M_impl.super__Rb_tree_header._M_node_count =
         local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var2;
    local_580.f.set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var2;
  }
  *(size_t *)((long)&(ptVar7->set)._M_t._M_impl + 0x28) = 0;
  local_1038 = local_1598;
  local_1048 = local_15a8;
  pVStack_1040 = pVStack_15a0;
  local_1058 = local_15b8;
  uStack_1050 = uStack_15b0;
  local_b40 = 0;
  local_10a0 = bVar8;
  if (bVar8) {
    std::__detail::__variant::_Move_ctor_base<$98354317$>::_Move_ctor_base
              ((_Move_ctor_base<_98354317_> *)&local_1030,(_Move_ctor_base<_98354317_> *)&local_1590
              );
  }
  p_Var3 = &local_b30._M_impl.super__Rb_tree_header;
  local_b38 = local_1098;
  if (local_1090._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var6 = &local_b30;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  else {
    p_Var6 = &local_1090;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1090._M_impl.super__Rb_tree_header._M_header._M_color;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1090._M_impl.super__Rb_tree_header._M_header._M_parent;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1090._M_impl.super__Rb_tree_header._M_header._M_left;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1090._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_1090._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
    local_b30._M_impl.super__Rb_tree_header._M_node_count =
         local_1090._M_impl.super__Rb_tree_header._M_node_count;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_1090._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  local_b40 = bVar8;
  (p_Var6->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_af8.i.i.outer.f.x = local_1038;
  local_af8.i.i.outer.f.this = pVStack_1040;
  local_af8.i.i.outer.i.f.a = local_1048;
  local_af8.i.i.outer.i.i.upper = uStack_1050;
  local_af8.i.i.outer.i.i.lower = local_1058;
  local_1620 = 0;
  bVar8 = local_b40 == '\x01';
  if (bVar8) {
    std::__detail::__variant::_Move_ctor_base<$98354317$>::_Move_ctor_base
              ((_Move_ctor_base<_98354317_> *)&local_1b10,(_Move_ctor_base<_98354317_> *)&local_1030
              );
  }
  p_Var1 = &_Stack_1610._M_impl.super__Rb_tree_header;
  local_1618 = local_b38;
  if (local_b30._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
    p_Var6 = &_Stack_1610;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  }
  else {
    p_Var6 = &local_b30;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_color =
         local_b30._M_impl.super__Rb_tree_header._M_header._M_color;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_b30._M_impl.super__Rb_tree_header._M_header._M_parent;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_left =
         local_b30._M_impl.super__Rb_tree_header._M_header._M_left;
    _Stack_1610._M_impl.super__Rb_tree_header._M_header._M_right =
         local_b30._M_impl.super__Rb_tree_header._M_header._M_right;
    (local_b30._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var1->_M_header;
    _Stack_1610._M_impl.super__Rb_tree_header._M_node_count =
         local_b30._M_impl.super__Rb_tree_header._M_node_count;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
    local_b30._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  }
  (p_Var6->_M_impl).super__Rb_tree_header._M_node_count = 0;
  local_af8.i.i.inner.super__Optional_base<_163239de_>._M_payload.
  super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = false;
  local_1620 = bVar8;
  local_15e0 = this;
  pvStack_15d8 = lits;
  local_15d0 = pCVar4;
  TStack_15c8._content = uVar5;
  if (bVar8) {
    std::__detail::__variant::_Copy_ctor_base<$98354317$>::_Copy_ctor_base
              ((_Copy_ctor_base<_98354317_> *)&local_af8.i.i.inner,
               (_Copy_ctor_base<_98354317_> *)&local_1b10);
  }
  local_af8.i.i.init = (bool)local_1618;
  ptVar7 = &local_af8.i.f;
  local_af8.i.i.inner.super__Optional_base<_163239de_>._M_payload.
  super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = bVar8;
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::_Rb_tree((_Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
              *)ptVar7,&_Stack_1610);
  local_af8.f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .config = local_15d0;
  local_af8.f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .inner.super_TermList._content = (TermList)(TermList)TStack_15c8._content;
  local_af8.f.this =
       (Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
        *)local_15e0;
  local_af8.f.lits = pvStack_15d8;
  viras::iter::
  FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:253:26)>_>
  ::FlattenIter(__return_storage_ptr__,&local_af8);
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree((_Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
               *)ptVar7);
  if (local_af8.i.i.inner.super__Optional_base<_163239de_>._M_payload.
      super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged ==
      true) {
    local_af8.i.i.inner.super__Optional_base<_163239de_>._M_payload.
    super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = false;
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage
              ((_Variant_storage<_98354317_> *)&local_af8.i.i.inner);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree(&_Stack_1610);
  if (local_1620 == '\x01') {
    local_1620 = '\0';
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage(&local_1b10);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree(&local_b30);
  if (local_b40 == '\x01') {
    local_b40 = '\0';
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage(&local_1030);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree(&local_1090);
  if (local_10a0 == '\x01') {
    local_10a0 = '\0';
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage(&local_1590);
  }
  std::
  _Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
  ::~_Rb_tree((_Rb_tree<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>,_std::_Identity<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::less<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>,_std::allocator<viras::VirtualTerm<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>_>_>
               *)&local_580.f);
  if (local_580.i.inner.super__Optional_base<_163239de_>._M_payload.
      super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged ==
      true) {
    local_580.i.inner.super__Optional_base<_163239de_>._M_payload.
    super__Optional_payload<_785ce8e0_>.super__Optional_payload_base<_5183a6a2_>._M_engaged = false;
    std::__detail::__variant::_Variant_storage<$98354317$>::~_Variant_storage
              ((_Variant_storage<_98354317_> *)&local_580.i.inner);
  }
  return __return_storage_ptr__;
}

Assistant:

auto quantifier_elimination(Var<C> const& x, std::vector<LiraLiteral<C>> const& lits)
    { return elim_set(x, lits)
        | iter::flat_map([this,&lits,x](auto t) { return vsubs(lits, x, t); }); }